

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall optCompare_valueOptEmpty_Test::TestBody(optCompare_valueOptEmpty_Test *this)

{
  opt<int,_mp::opt_null_value_policy<int,__1>_> *this_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_1d8;
  AssertHelper local_1b8;
  Message local_1b0;
  int local_1a8;
  bool local_1a1;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_170;
  Message local_168;
  int local_160;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_128;
  Message local_120;
  int local_118;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e0;
  Message local_d8;
  int local_d0;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_98;
  Message local_90;
  int local_88;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_50;
  Message local_48 [3];
  int local_30;
  bool local_29;
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  opt_int i;
  optCompare_valueOptEmpty_Test *this_local;
  
  this_00 = (opt<int,_mp::opt_null_value_policy<int,__1>_> *)((long)&gtest_ar_.message_.ptr_ + 4);
  mp::opt<int,_mp::opt_null_value_policy<int,_-1>_>::opt(this_00);
  local_30 = 1;
  local_29 = mp::operator==(&local_30,this_00);
  local_29 = !local_29;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_28,&local_29,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_28,(AssertionResult *)"1 == i",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x441,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_88 = 1;
  local_81 = mp::operator!=(&local_88,
                            (opt<int,_mp::opt_null_value_policy<int,__1>_> *)
                            ((long)&gtest_ar_.message_.ptr_ + 4));
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_80,(AssertionResult *)"1 != i",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x442,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_d0 = 1;
  local_c9 = mp::operator<(&local_d0,
                           (opt<int,_mp::opt_null_value_policy<int,__1>_> *)
                           ((long)&gtest_ar_.message_.ptr_ + 4));
  local_c9 = !local_c9;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c8,&local_c9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_c8,(AssertionResult *)"1 < i",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x443,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_118 = 1;
  local_111 = mp::operator>(&local_118,
                            (opt<int,_mp::opt_null_value_policy<int,__1>_> *)
                            ((long)&gtest_ar_.message_.ptr_ + 4));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_110,&local_111,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_110,(AssertionResult *)"1 > i",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x444,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  local_160 = 1;
  local_159 = mp::operator<=(&local_160,
                             (opt<int,_mp::opt_null_value_policy<int,__1>_> *)
                             ((long)&gtest_ar_.message_.ptr_ + 4));
  local_159 = !local_159;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_158,&local_159,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_158,(AssertionResult *)"1 <= i",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x445,pcVar2);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_1a8 = 1;
  local_1a1 = mp::operator>=(&local_1a8,
                             (opt<int,_mp::opt_null_value_policy<int,__1>_> *)
                             ((long)&gtest_ar_.message_.ptr_ + 4));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a0,&local_1a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d8,(internal *)local_1a0,(AssertionResult *)"1 >= i","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x446,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  return;
}

Assistant:

TEST(optCompare, valueOptEmpty)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i;
  EXPECT_FALSE(1 == i);
  EXPECT_TRUE(1 != i);
  EXPECT_FALSE(1 < i);
  EXPECT_TRUE(1 > i);
  EXPECT_FALSE(1 <= i);
  EXPECT_TRUE(1 >= i);
}